

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringExtraTest_InternalSwap_Test::
~MicroStringExtraTest_InternalSwap_Test(MicroStringExtraTest_InternalSwap_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(MicroStringExtraTest, InternalSwap) {
  constexpr absl::string_view lhs_value =
      "Very long string that is not SSO and unlikely to use the same capacity "
      "as the other value.";
  constexpr absl::string_view rhs_value = "123456789012345";

  MicroStringExtra<15> lhs, rhs;
  lhs.Set(lhs_value, nullptr);
  rhs.Set(rhs_value, nullptr);

  const size_t used_lhs = lhs.SpaceUsedExcludingSelfLong();
  const size_t used_rhs = rhs.SpaceUsedExcludingSelfLong();

  // Verify setup.
  ASSERT_EQ(lhs.Get(), lhs_value);
  ASSERT_EQ(rhs.Get(), rhs_value);

  lhs.InternalSwap(&rhs);

  EXPECT_EQ(lhs.Get(), rhs_value);
  EXPECT_EQ(rhs.Get(), lhs_value);
  EXPECT_EQ(used_rhs, lhs.SpaceUsedExcludingSelfLong());
  EXPECT_EQ(used_lhs, rhs.SpaceUsedExcludingSelfLong());

  lhs.Destroy();
  rhs.Destroy();
}